

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

mat4 * mat4_orthographic_projection
                 (mat4 *__return_storage_ptr__,float left,float right,float bottom,float top,
                 float near,float far)

{
  float f;
  float e;
  float d;
  float c;
  float b;
  float a;
  float far_local;
  float near_local;
  float top_local;
  float bottom_local;
  float right_local;
  float left_local;
  
  mat4_create(__return_storage_ptr__,2.0 / (right - left),0.0,0.0,-(right + left) / (right - left),
              0.0,2.0 / (top - bottom),0.0,-(top + bottom) / (top - bottom),0.0,0.0,
              -2.0 / (far - near),-(far + near) / (far - near),0.0,0.0,0.0,1.0);
  return __return_storage_ptr__;
}

Assistant:

mat4 mat4_orthographic_projection(float left, float right, float bottom, float top,
        float near, float far) {
    float a = 2.0f / (right - left);
    float b = 2.0f / (top - bottom);
    float c = -2.0f / (far - near);
    float d = -(right + left) / (right - left);
    float e = -(top + bottom) / (top - bottom);
    float f = -(far + near) / (far - near);

    return mat4_create(
            a, 0.0f, 0.0f, d,
            0.0f, b, 0.0f, e,
            0.0f, 0.0f, c, f,
            0.0f, 0.0f, 0.0f, 1.0f);
}